

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<128U,_12U,_buffer_layout_bfs>::operator()
          (fill<128U,_12U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long *puVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  ostream *poVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  size_t n0;
  long lVar10;
  size_t sVar11;
  unsigned_long *puVar12;
  fill<128U,_24U,_buffer_layout_bfs> local_5c;
  fill<128U,_25U,_buffer_layout_bfs> local_5b;
  fill<128U,_25U,_buffer_layout_bfs> local_5a;
  fill<128U,_24U,_buffer_layout_bfs> local_59;
  uchar **local_58;
  array<Stream,_128UL> *local_50;
  DI __d;
  
  local_50 = streams;
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"fill_inner");
  poVar6 = std::operator<<(poVar6,", inner, I=");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 0x18;
  puVar12 = buffer_count->_M_elems + 0x19;
  local_58 = buffer + 400;
  n0 = 0;
  lVar10 = 0;
  do {
    uVar8 = *puVar1;
    if (uVar8 == 0) {
      fill<128U,_24U,_buffer_layout_bfs>::operator()(&local_59,local_50,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"left stream drained\n");
        sVar11 = -lVar10;
        lVar10 = -n0;
        uVar8 = *puVar12;
        goto LAB_0017102c;
      }
    }
    uVar9 = *puVar12;
    if (uVar9 == 0) {
      fill<128U,_25U,_buffer_layout_bfs>::operator()(&local_5a,local_50,buffer,buffer_count);
      uVar9 = *puVar12;
      if (uVar9 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"right stream drained\n");
        sVar11 = -lVar10;
        lVar10 = -n0;
        uVar8 = *puVar1;
        goto LAB_001710f8;
      }
      uVar8 = *puVar1;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,"L:\'");
    ppuVar2 = buffer + (0x3501 - uVar8);
    poVar6 = std::operator<<(poVar6,(char *)*ppuVar2);
    poVar6 = std::operator<<(poVar6,"\', R:\'");
    ppuVar4 = buffer + (0x3aaa - uVar9);
    poVar6 = std::operator<<(poVar6,(char *)*ppuVar4);
    std::operator<<(poVar6,"\'\n");
    iVar5 = cmp(*ppuVar2,*ppuVar4);
    puVar7 = puVar12;
    if (iVar5 < 1) {
      puVar7 = puVar1;
      ppuVar4 = ppuVar2;
    }
    puVar3 = *ppuVar4;
    *puVar7 = *puVar7 - 1;
    buffer[n0 + 400] = puVar3;
    check_input(local_58,n0);
    lVar10 = lVar10 + -8;
    n0 = n0 + 1;
  } while (n0 != 0x20);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"Done, buffer filled\n");
  buffer_count->_M_elems[0xc] = 0x20;
  goto LAB_00171256;
LAB_0017102c:
  do {
    if (uVar8 == 0) {
      fill<128U,_25U,_buffer_layout_bfs>::operator()(&local_5b,local_50,buffer,buffer_count);
      uVar8 = *puVar12;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"both streams prematurely drained\n");
        memmove(buffer + lVar10 + 0x1b0,local_58,sVar11);
        buffer_count->_M_elems[0xc] = -lVar10;
        check_input((uchar **)((long)buffer + (0xd80 - sVar11)),-lVar10);
        goto LAB_00171256;
      }
    }
    *(uchar **)((long)buffer + sVar11 + 0xc80) = buffer[0x3aaa - uVar8];
    uVar8 = uVar8 - 1;
    *puVar12 = uVar8;
    lVar10 = lVar10 + -1;
    sVar11 = sVar11 + 8;
  } while (sVar11 != 0x100);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"\tbuffer filled\n");
  buffer_count->_M_elems[0xc] = 0x20;
  check_input(local_58,0x20);
  goto LAB_00171256;
LAB_001710f8:
  do {
    if (uVar8 == 0) {
      fill<128U,_24U,_buffer_layout_bfs>::operator()(&local_5c,local_50,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"both streams prematurely drained\n");
        memmove(buffer + lVar10 + 0x1b0,local_58,sVar11);
        buffer_count->_M_elems[0xc] = -lVar10;
        check_input((uchar **)((long)buffer + (0xd80 - sVar11)),-lVar10);
        goto LAB_00171256;
      }
    }
    *(uchar **)((long)buffer + sVar11 + 0xc80) = buffer[0x3501 - uVar8];
    uVar8 = uVar8 - 1;
    *puVar1 = uVar8;
    lVar10 = lVar10 + -1;
    sVar11 = sVar11 + 8;
  } while (sVar11 != 0x100);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"buffer filled\n");
  buffer_count->_M_elems[0xc] = 0x20;
  check_input(local_58,0x20);
LAB_00171256:
  anon_func::DI::~DI(&__d);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}